

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Emu.cpp
# Opt level: O0

int __thiscall Hes_Emu::cpu_read_(Hes_Emu *this,hes_addr_t addr)

{
  int present;
  uint uVar1;
  time_t tVar2;
  time_t *in_RSI;
  Hes_Emu *in_RDI;
  int status;
  hes_time_t time;
  undefined4 in_stack_ffffffffffffffe4;
  uint local_4;
  
  tVar2 = Hes_Cpu::time(&in_RDI->super_Hes_Cpu,in_RSI);
  present = (int)tVar2;
  uVar1 = (uint)in_RSI & 0x1fff;
  if (((ulong)in_RSI & 0x1fff) == 0) {
    if (present < (in_RDI->irq).vdp) {
      local_4 = 0;
    }
    else {
      (in_RDI->irq).vdp = 0x40000000;
      run_until(in_RDI,present);
      irq_changed((Hes_Emu *)CONCAT44(in_stack_ffffffffffffffe4,uVar1));
      local_4 = 0x20;
    }
  }
  else if (uVar1 - 2 < 2) {
    local_4 = 0;
  }
  else if (uVar1 - 0xc00 < 2) {
    run_until(in_RDI,present);
    local_4 = ((in_RDI->timer).count - 1U) / (uint)in_RDI->timer_base;
  }
  else if (uVar1 == 0x1402) {
    local_4 = (uint)(in_RDI->irq).disables;
  }
  else if (uVar1 == 0x1403) {
    local_4 = 0;
    if ((in_RDI->irq).timer <= present) {
      local_4 = 4;
    }
    if ((in_RDI->irq).vdp <= present) {
      local_4 = local_4 | 2;
    }
  }
  else {
    local_4 = 0xff;
  }
  return local_4;
}

Assistant:

int Hes_Emu::cpu_read_( hes_addr_t addr )
{
	hes_time_t time = this->time();
	addr &= page_size - 1;
	switch ( addr )
	{
	case 0x0000:
		if ( irq.vdp > time )
			return 0;
		irq.vdp = future_hes_time;
		run_until( time );
		irq_changed();
		return 0x20;
		
	case 0x0002:
	case 0x0003:
		debug_printf( "VDP read not supported: %d\n", addr );
		return 0;
	
	case 0x0C01:
		//return timer.enabled; // TODO: remove?
	case 0x0C00:
		run_until( time );
		debug_printf( "Timer count read\n" );
		return (unsigned) (timer.count - 1) / timer_base;
	
	case 0x1402:
		return irq.disables;
	
	case 0x1403:
		{
			int status = 0;
			if ( irq.timer <= time ) status |= timer_mask;
			if ( irq.vdp   <= time ) status |= vdp_mask;
			return status;
		}
		
	#ifndef NDEBUG
		case 0x1000: // I/O port
		case 0x180C: // CD-ROM
		case 0x180D:
			break;
		
		default:
			debug_printf( "unmapped read  $%04X\n", addr );
	#endif
	}
	
	return unmapped;
}